

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O0

void __thiscall
syntax_tests::iu_SyntaxTest_x_iutest_x_VariadicNotNull_Test::
~iu_SyntaxTest_x_iutest_x_VariadicNotNull_Test(iu_SyntaxTest_x_iutest_x_VariadicNotNull_Test *this)

{
  iu_SyntaxTest_x_iutest_x_VariadicNotNull_Test *this_local;
  
  ~iu_SyntaxTest_x_iutest_x_VariadicNotNull_Test(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

IUTEST(SyntaxTest, VariadicNotNull)
{
    if( void* p = this )
        IUTEST_ASSERT_NOTNULL(T<0, 0>::call(p)) << p;
    if( void* p = this )
        IUTEST_EXPECT_NOTNULL(T<0, 0>::call(p)) << p;
    if( void* p = this )
        IUTEST_INFORM_NOTNULL(T<0, 0>::call(p)) << p;
    if( void* p = this )
        IUTEST_ASSUME_NOTNULL(T<0, 0>::call(p)) << p;
}